

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

int cimg_library::CImgDisplay::screen_height(void)

{
  int iVar1;
  long lVar2;
  CImgDisplayException *this;
  
  if (cimg::X11_attr()::val == '\0') {
    iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val);
    if (iVar1 != 0) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
  }
  if (cimg::X11_attr::val.display == (Display *)0x0) {
    lVar2 = XOpenDisplay(0);
    if (lVar2 == 0) {
      this = (CImgDisplayException *)__cxa_allocate_exception(0x10);
      CImgDisplayException::CImgDisplayException
                (this,"CImgDisplay::screen_height(): Failed to open X11 display.");
      __cxa_throw(this,&CImgDisplayException::typeinfo,CImgException::~CImgException);
    }
    iVar1 = *(int *)(*(long *)(lVar2 + 0xe8) + 0x1c + (long)*(int *)(lVar2 + 0xe0) * 0x80);
    XCloseDisplay(lVar2);
  }
  else {
    iVar1 = *(int *)(*(long *)(cimg::X11_attr::val.display + 0xe8) + 0x1c +
                    (long)*(int *)(cimg::X11_attr::val.display + 0xe0) * 0x80);
  }
  return iVar1;
}

Assistant:

inline X11_static& X11_attr() { static X11_static val; return val; }